

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

options_i * load_header_merge_options(options_i *options,vw *all,io_buf *model)

{
  byte bVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  basic_command_line_parser<char> *this;
  long lVar5;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  int iVar7;
  iterator __begin4;
  pointer pbVar8;
  bool bVar9;
  string saved_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source;
  basic_option<char> opt;
  string file_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  container;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> token;
  parsed_options pos;
  string local_2b0;
  undefined1 local_290 [48];
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  bool local_238;
  options_description desc;
  istringstream ss;
  
  file_options._M_dataplus._M_p = (pointer)&file_options.field_2;
  file_options._M_string_length = 0;
  file_options.field_2._M_local_buf[0] = '\0';
  save_load_header(all,model,true,false,&file_options,options);
  std::__cxx11::string::string((string *)&local_2b0,(string *)&file_options);
  interactions_settings_doubled = check_interaction_settings_collision(options,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&file_options,_S_in);
  std::
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)local_290,(istream_type *)&ss);
  local_260 = (undefined1  [8])0x0;
  local_258._M_p = (pointer)&local_248;
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_238 = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&container,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_290,
             (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
              *)local_260,(allocator_type *)&desc);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)(local_290 + 8));
  std::__cxx11::string::string((string *)&opt,"",(allocator *)&pos);
  boost::program_options::options_description::options_description
            (&desc,(string *)&opt,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&opt);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&opt,&container);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&opt,&desc);
  boost::program_options::detail::cmdline::allow_unregistered();
  boost::program_options::basic_command_line_parser<char>::run(&pos,this);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&opt);
  std::__cxx11::string::string((string *)&saved_key,"",(allocator *)&opt);
  bVar1 = 0;
  iVar7 = 0;
  bVar4 = false;
  pbVar6 = pos.options.
           super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar6 == pos.options.
                  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if ((iVar7 == 0) && (bVar4 = std::operator!=(&saved_key,""), bVar4)) {
        std::__cxx11::string::string((string *)&opt,"",(allocator *)&token);
        (*options->_vptr_options_i[5])(options,&saved_key,&opt);
        std::__cxx11::string::~string((string *)&opt);
      }
      std::__cxx11::string::~string((string *)&saved_key);
      std::
      vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ::~vector(&pos.options);
      boost::program_options::options_description::~options_description(&desc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&container);
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
      std::__cxx11::string::~string((string *)&file_options);
      return options;
    }
    boost::program_options::basic_option<char>::basic_option(&opt,pbVar6);
    pbVar2 = opt.original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = opt.original_tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (bVar4) {
      for (; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
        std::__cxx11::string::string((string *)&token,(string *)pbVar8);
        lVar5 = std::__cxx11::string::find((char *)&token,0x23e7d0);
        if (lVar5 != -1) {
          bVar4 = false;
        }
        std::__cxx11::string::~string((string *)&token);
      }
      if (!bVar4) goto LAB_00129172;
      std::__cxx11::string::assign((char *)&saved_key);
    }
    else {
LAB_00129172:
      if ((opt.string_key._M_string_length < 2) || (*opt.string_key._M_dataplus._M_p != '-')) {
        bVar9 = false;
      }
      else {
        bVar9 = (byte)(opt.string_key._M_dataplus._M_p[1] - 0x30U) < 10;
      }
      if (interactions_settings_doubled == true) {
        bVar3 = std::operator==(&opt.string_key,"quadratic");
        if (((bVar3) || (bVar3 = std::operator==(&opt.string_key,"cubic"), bVar3)) ||
           (bVar3 = std::operator==(&opt.string_key,"interactions"), bVar3)) {
          bVar4 = true;
          goto LAB_001292ff;
        }
      }
      __x = &opt.original_tokens;
      if (!bVar9) {
        bVar9 = std::operator!=(&opt.string_key,"");
        __x = &opt.value;
        if (bVar9) {
          if ((bool)(iVar7 == 0 & bVar1)) {
            std::__cxx11::string::string((string *)&token,"",(allocator *)&source);
            (*options->_vptr_options_i[5])(options,&saved_key,&token);
            std::__cxx11::string::~string((string *)&token);
          }
          std::__cxx11::string::_M_assign((string *)&saved_key);
          pbVar2 = opt.value.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar1 = 1;
          iVar7 = 0;
          pbVar8 = opt.value.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (opt.value.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              opt.value.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            for (; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
              std::__cxx11::string::string((string *)&token,(string *)pbVar8);
              (*options->_vptr_options_i[5])(options,&saved_key,&token);
              iVar7 = iVar7 + 1;
              std::__cxx11::string::~string((string *)&token);
            }
          }
          goto LAB_001292ff;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&source,__x);
      pbVar2 = source.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = source.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::string((string *)&token,(string *)pbVar8);
        (*options->_vptr_options_i[5])(options,&saved_key,&token);
        iVar7 = iVar7 + 1;
        std::__cxx11::string::~string((string *)&token);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&source);
    }
LAB_001292ff:
    boost::program_options::basic_option<char>::~basic_option(&opt);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

options_i& load_header_merge_options(options_i& options, vw& all, io_buf& model)
{
  std::string file_options;
  save_load_header(all, model, true, false, file_options, options);

  interactions_settings_doubled = check_interaction_settings_collision(options, file_options);

  // Convert file_options into a vector.
  std::istringstream ss{file_options};
  std::vector<std::string> container{std::istream_iterator<std::string>{ss}, std::istream_iterator<std::string>{}};

  po::options_description desc("");

  // Get list of options in file options string
  po::parsed_options pos = po::command_line_parser(container).options(desc).allow_unregistered().run();

  bool skipping = false;
  std::string saved_key = "";
  unsigned int count = 0;
  bool first_seen = false;
  for (auto opt : pos.options)
  {
    // If we previously encountered an option we want to skip, ignore tokens without --.
    if (skipping)
    {
      for (auto token : opt.original_tokens)
      {
        auto found = token.find("--");
        if (found != std::string::npos)
        {
          skipping = false;
        }
      }

      if (skipping)
      {
        saved_key = "";
        continue;
      }
    }

    bool treat_as_value = false;
    // If the key starts with a digit, this is a mis-interpretation of a value as a key. Pull it into the previous
    // option. This was found in the case of --lambda -1, misinterpreting -1 as an option key. The easy way to fix this
    // requires introducing "identifier-like" semantics for options keys, e.g. "does not begin with a digit". That does
    // not seem like an unreasonable restriction. The logical check here is: is "string_key" of the form {'-', <digit>,
    // <etc.>}.
    if (opt.string_key.length() > 1 && opt.string_key[0] == '-' && opt.string_key[1] >= '0' && opt.string_key[1] <= '9')
    {
      treat_as_value = true;
    }

    // If the interaction settings are doubled, the copy in the model file is ignored.
    if (interactions_settings_doubled &&
        (opt.string_key == "quadratic" || opt.string_key == "cubic" || opt.string_key == "interactions"))
    {
      // skip this option.
      skipping = true;
      continue;
    }

    // File options should always use long form.

    // If the key is empty this must be a value, otherwise set the key.
    if (!treat_as_value && opt.string_key != "")
    {
      // If the new token is a new option and there were no values previously it was a bool option. Add it as a switch.
      if (count == 0 && first_seen)
      {
        options.insert(saved_key, "");
      }

      saved_key = opt.string_key;
      count = 0;
      first_seen = true;

      if (opt.value.size() > 0)
      {
        for (auto value : opt.value)
        {
          options.insert(saved_key, value);
          count++;
        }
      }
    }
    else
    {
      // If treat_as_value is set, boost incorrectly interpreted the token as containing an option key
      // In this case, what should have happened is all original_tokens items should be in value.
      auto source = treat_as_value ? opt.original_tokens : opt.value;
      for (auto value : source)
      {
        options.insert(saved_key, value);
        count++;
      }
    }
  }

  if (count == 0 && saved_key != "")
  {
    options.insert(saved_key, "");
  }

  return options;
}